

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

char * fmt::v11::detail::invoke_parse<fmt::v11::basic_string_view<char>&,char>
                 (parse_context<char> *ctx)

{
  char *pcVar1;
  native_formatter<fmt::v11::basic_string_view<char>,_char,_(fmt::v11::detail::type)13> local_38;
  
  local_38.specs_.width_ref.name.size_ = 0;
  local_38.specs_.precision_ref.name.size_ = 0;
  local_38.specs_.super_format_specs.super_basic_specs.data_ = 0x8000;
  local_38.specs_.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
  local_38.specs_.super_format_specs.super_basic_specs.fill_data_[1] = '\0';
  local_38.specs_.super_format_specs.super_basic_specs.fill_data_[2] = '\0';
  local_38.specs_.super_format_specs.super_basic_specs.fill_data_[3] = '\0';
  local_38.specs_.super_format_specs.width._0_1_ = 0;
  local_38.specs_.super_format_specs._9_7_ = 0xffffffff000000;
  local_38.specs_.width_ref.name.data_ = (char *)0x0;
  local_38.specs_.precision_ref.name.data_ = (char *)0x0;
  pcVar1 = native_formatter<fmt::v11::basic_string_view<char>,_char,_(fmt::v11::detail::type)13>::
           parse(&local_38,ctx);
  return pcVar1;
}

Assistant:

FMT_CONSTEXPR auto invoke_parse(parse_context<Char>& ctx) -> const Char* {
  using mapped_type = remove_cvref_t<mapped_t<T, Char>>;
  constexpr bool formattable =
      std::is_constructible<formatter<mapped_type, Char>>::value;
  if (!formattable) return ctx.begin();  // Error is reported in the value ctor.
  using formatted_type = conditional_t<formattable, mapped_type, int>;
  return formatter<formatted_type, Char>().parse(ctx);
}